

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O0

string * __thiscall
spvtools::val::(anonymous_namespace)::ToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,CapabilitySet *capabilities,
          AssemblyGrammar *grammar)

{
  AssemblyGrammar *this_00;
  bool bVar1;
  spv_result_t sVar2;
  ostream *poVar3;
  spv_operand_desc local_1f0;
  spv_operand_desc desc;
  undefined1 local_1e0 [4];
  Capability capability;
  iterator __end2;
  iterator __begin2;
  CapabilitySet *__range2;
  stringstream ss;
  ostream aoStack_198 [376];
  AssemblyGrammar *local_20;
  AssemblyGrammar *grammar_local;
  CapabilitySet *capabilities_local;
  
  local_20 = (AssemblyGrammar *)capabilities;
  grammar_local = (AssemblyGrammar *)this;
  capabilities_local = (CapabilitySet *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&__range2);
  this_00 = grammar_local;
  EnumSet<spv::Capability>::begin
            ((iterator *)&__end2.bucketOffset_,(EnumSet<spv::Capability> *)grammar_local);
  EnumSet<spv::Capability>::end((iterator *)local_1e0,(EnumSet<spv::Capability> *)this_00);
  while( true ) {
    bVar1 = EnumSet<spv::Capability>::Iterator::operator!=
                      ((Iterator *)&__end2.bucketOffset_,(Iterator *)local_1e0);
    if (!bVar1) break;
    desc._4_4_ = EnumSet<spv::Capability>::Iterator::operator*((Iterator *)&__end2.bucketOffset_);
    sVar2 = AssemblyGrammar::lookupOperand
                      (local_20,SPV_OPERAND_TYPE_CAPABILITY,desc._4_4_,&local_1f0);
    if (sVar2 == SPV_SUCCESS) {
      poVar3 = std::operator<<(aoStack_198,local_1f0->name);
      std::operator<<(poVar3," ");
    }
    else {
      poVar3 = (ostream *)std::ostream::operator<<(aoStack_198,desc._4_4_);
      std::operator<<(poVar3," ");
    }
    EnumSet<spv::Capability>::Iterator::operator++((Iterator *)&__end2.bucketOffset_);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(const CapabilitySet& capabilities,
                     const AssemblyGrammar& grammar) {
  std::stringstream ss;
  for (auto capability : capabilities) {
    spv_operand_desc desc;
    if (SPV_SUCCESS == grammar.lookupOperand(SPV_OPERAND_TYPE_CAPABILITY,
                                             uint32_t(capability), &desc))
      ss << desc->name << " ";
    else
      ss << uint32_t(capability) << " ";
  }
  return ss.str();
}